

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

void gauden_norm_wt_var(vector_t ***in_var,vector_t ***wt_var,int32 pass2var,float32 ***dnom,
                       vector_t ***mean,uint32 n_mgau,uint32 n_feat,uint32 n_density,uint32 *veclen,
                       int32 tiedvar)

{
  uint uVar1;
  vector_t pfVar2;
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  
  uVar8 = (ulong)n_feat;
  uVar10 = (ulong)n_density;
  uVar9 = (ulong)n_mgau;
  if (tiedvar != 0) {
    for (uVar4 = 0; uVar4 != uVar8; uVar4 = uVar4 + 1) {
      uVar5 = 1;
      if (pass2var == 0) {
        uVar1 = veclen[uVar4];
        for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
          (*(*mean)[uVar4])[uVar6] = (float)*(*dnom)[uVar4] * (*(*mean)[uVar4])[uVar6];
        }
      }
      for (; uVar5 < uVar10; uVar5 = uVar5 + 1) {
        uVar1 = veclen[uVar4];
        for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
          pfVar2 = *(*wt_var)[uVar4];
          pfVar2[uVar6] = (*wt_var)[uVar4][uVar5][uVar6] + pfVar2[uVar6];
          if (pass2var == 0) {
            pfVar2 = *(*mean)[uVar4];
            pfVar2[uVar6] =
                 (*mean)[uVar4][uVar5][uVar6] * (float)(*dnom)[uVar4][uVar5] + pfVar2[uVar6];
          }
        }
        pfVar3 = (float *)(*dnom)[uVar4];
        *pfVar3 = pfVar3[uVar5] + *pfVar3;
      }
    }
    for (uVar4 = 1; uVar4 < uVar9; uVar4 = uVar4 + 1) {
      for (uVar5 = 0; uVar5 != uVar8; uVar5 = uVar5 + 1) {
        for (uVar6 = 0; uVar6 != uVar10; uVar6 = uVar6 + 1) {
          uVar1 = veclen[uVar5];
          for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
            (*(*wt_var)[uVar5])[uVar7] =
                 wt_var[uVar4][uVar5][uVar6][uVar7] + (*(*wt_var)[uVar5])[uVar7];
            if (pass2var == 0) {
              (*(*mean)[uVar5])[uVar7] =
                   mean[uVar4][uVar5][uVar6][uVar7] * (float)dnom[uVar4][uVar5][uVar6] +
                   (*(*mean)[uVar5])[uVar7];
            }
          }
          *(*dnom)[uVar5] = (float32)((float)dnom[uVar4][uVar5][uVar6] + (float)*(*dnom)[uVar5]);
        }
      }
    }
    for (uVar4 = 0; uVar4 != uVar9; uVar4 = uVar4 + 1) {
      for (uVar5 = 0; uVar5 != uVar8; uVar5 = uVar5 + 1) {
        for (uVar6 = 0; uVar6 != uVar10; uVar6 = uVar6 + 1) {
          uVar1 = veclen[uVar5];
          for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
            if (pass2var == 0) {
              if ((int)uVar6 == 0 && (int)uVar4 == 0) {
                (*(*mean)[uVar5])[uVar7] = (*(*mean)[uVar5])[uVar7] / (float)*(*dnom)[uVar5];
              }
              else {
                mean[uVar4][uVar5][uVar6][uVar7] = (*(*mean)[uVar5])[uVar7];
              }
            }
            wt_var[uVar4][uVar5][uVar6][uVar7] = (*(*wt_var)[uVar5])[uVar7];
          }
          dnom[uVar4][uVar5][uVar6] = *(*dnom)[uVar5];
        }
      }
    }
  }
  for (uVar8 = 0; uVar8 != uVar9; uVar8 = uVar8 + 1) {
    for (uVar10 = 0; uVar10 != n_feat; uVar10 = uVar10 + 1) {
      for (uVar4 = 0; uVar4 != n_density; uVar4 = uVar4 + 1) {
        if (((float)dnom[uVar8][uVar10][uVar4] != 0.0) || (NAN((float)dnom[uVar8][uVar10][uVar4])))
        {
          for (uVar5 = 0; uVar5 < veclen[uVar10]; uVar5 = uVar5 + 1) {
            if (pass2var == 0) {
              fVar11 = wt_var[uVar8][uVar10][uVar4][uVar5] / (float)dnom[uVar8][uVar10][uVar4] -
                       mean[uVar8][uVar10][uVar4][uVar5] * mean[uVar8][uVar10][uVar4][uVar5];
              wt_var[uVar8][uVar10][uVar4][uVar5] = fVar11;
            }
            else {
              fVar11 = wt_var[uVar8][uVar10][uVar4][uVar5] / (float)dnom[uVar8][uVar10][uVar4];
              wt_var[uVar8][uVar10][uVar4][uVar5] = fVar11;
            }
            if (fVar11 < 0.0) {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                      ,0x694,
                      "Variance (mgau= %u, feat= %u, density=%u, component=%u) is less then 0. Most probably the number of senones is too high for such a small training database. Use smaller $CFG_N_TIED_STATES.\n"
                      ,uVar8 & 0xffffffff,uVar10 & 0xffffffff,uVar4,uVar5);
            }
          }
        }
        else if (in_var != (vector_t ***)0x0) {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                  ,0x69b,"Copying unseen var (%u, %u, %u) from in_var\n",uVar8 & 0xffffffff,
                  uVar10 & 0xffffffff,uVar4);
          uVar1 = veclen[uVar10];
          for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
            wt_var[uVar8][uVar10][uVar4][uVar5] = in_var[uVar8][uVar10][uVar4][uVar5];
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
gauden_norm_wt_var(vector_t ***in_var,
		   vector_t ***wt_var,
		   int32 pass2var,
		   float32 ***dnom,
		   vector_t ***mean,
		   uint32 n_mgau,
		   uint32 n_feat,
		   uint32 n_density,
		   const uint32 *veclen,
		   int32 tiedvar)
{
    uint32 i, j, k, l;

    if (tiedvar) {
	gauden_tie_vars_dnoms(wt_var, pass2var, dnom, mean,
			      n_mgau, n_feat, n_density, veclen);
    }
    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		if (dnom[i][j][k] != 0) {
		    for (l = 0; l < veclen[j]; l++) {
			if (!pass2var) {
			    wt_var[i][j][k][l] =
				(wt_var[i][j][k][l] / dnom[i][j][k]) -
				(mean[i][j][k][l] * mean[i][j][k][l]);
			}
			else {
			    wt_var[i][j][k][l] /= dnom[i][j][k];
			}

			if (wt_var[i][j][k][l] < 0) {
			    E_ERROR("Variance (mgau= %u, feat= %u, "
				    "density=%u, component=%u) is less then 0. "
				    "Most probably the number of senones is "
				    "too high for such a small training "
				    "database. Use smaller $CFG_N_TIED_STATES.\n",
				    i, j, k, l);
			}
		    }
		}
		else {
		    if (in_var) {
			E_INFO("Copying unseen var (%u, %u, %u) from in_var\n",
			       i, j, k);
			for (l = 0; l < veclen[j]; l++) {
			    wt_var[i][j][k][l] = in_var[i][j][k][l];
			}
		    }
		}
	    }
	}
    }
}